

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptorKeyAndModuleName
          (Generator *this,ServiceDescriptor *descriptor)

{
  Printer *pPVar1;
  string *filename;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ServiceDescriptor *local_18;
  ServiceDescriptor *descriptor_local;
  Generator *this_local;
  
  pPVar1 = this->printer_;
  local_18 = descriptor;
  descriptor_local = (ServiceDescriptor *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DESCRIPTOR",&local_39);
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_70,this,local_18);
  io::Printer::Print(pPVar1,"$descriptor_key$ = $descriptor_name$,\n","descriptor_key",&local_38,
                     "descriptor_name",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pPVar1 = this->printer_;
  filename = FileDescriptor::name_abi_cxx11_(this->file_);
  anon_unknown_0::ModuleName(&local_90,filename);
  io::Printer::Print(pPVar1,"__module__ = \'$module_name$\'\n","module_name",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void Generator::PrintDescriptorKeyAndModuleName(
    const ServiceDescriptor& descriptor) const {
  printer_->Print(
      "$descriptor_key$ = $descriptor_name$,\n",
      "descriptor_key", kDescriptorKey,
      "descriptor_name", ModuleLevelServiceDescriptorName(descriptor));
  printer_->Print(
      "__module__ = '$module_name$'\n",
      "module_name", ModuleName(file_->name()));
}